

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

bool chaiscript::dispatch::detail::
     call_func<bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept,bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (undefined8 param_1,undefined8 *param_2,long *param_3,Type_Conversions_State *param_4
               )

{
  code *pcVar1;
  undefined1 uVar2;
  Boxed_Value BVar3;
  chaiscript acStack_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  chaiscript local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pcVar1 = (code *)*param_2;
  boxed_cast<chaiscript::Boxed_Value_const&>(acStack_38,(Boxed_Value *)*param_3,param_4);
  BVar3 = boxed_cast<chaiscript::Boxed_Value_const&>
                    (local_28,(Boxed_Value *)(*param_3 + 0x10),param_4);
  uVar2 = (*pcVar1)(acStack_38,local_28,
                    BVar3.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return (bool)uVar2;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }